

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall
QAbstractItemView::inputMethodEvent(QAbstractItemView *this,QInputMethodEvent *event)

{
  long lVar1;
  long lVar2;
  Data *pDVar3;
  bool bVar4;
  char cVar5;
  FocusPolicy FVar6;
  QEditorInfo *pQVar7;
  QAbstractItemViewPrivate *pQVar8;
  QAbstractItemViewPrivate *pQVar9;
  QWidget *editor;
  long in_FS_OFFSET;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = *(QAbstractItemViewPrivate **)(this + 8);
  lVar1 = *(long *)(event + 0x20);
  lVar2 = *(long *)(event + 0x38);
  currentIndex(&local_50,this);
  pQVar7 = QAbstractItemViewPrivate::editorForIndex(pQVar9,&local_50);
  pDVar3 = (pQVar7->widget).wp.d;
  if (((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) ||
     (editor = (QWidget *)(pQVar7->widget).wp.value, editor == (QWidget *)0x0)) {
    if (lVar1 != 0) {
      pQVar9->waitForIMCommit = true;
      bVar4 = true;
      goto LAB_004e5c2c;
    }
    if (lVar2 != 0) goto LAB_004e5c2a;
LAB_004e5cac:
    event[0xc] = (QInputMethodEvent)0x0;
  }
  else {
    if (pQVar9->waitForIMCommit == true) {
      if (lVar2 != 0 || lVar1 == 0) {
        pQVar9->waitForIMCommit = false;
        QCoreApplication::sendEvent((QObject *)editor,(QEvent *)event);
        if (lVar2 == 0) {
          currentIndex(&local_50,this);
          pQVar9 = (QAbstractItemViewPrivate *)this;
          pQVar8 = (QAbstractItemViewPrivate *)(**(code **)(*(long *)this + 0x208))(this,&local_50);
          if (pQVar8 != (QAbstractItemViewPrivate *)0x0) {
            currentIndex(&local_50,this);
            (**(code **)(*(long *)&(pQVar8->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                   super_QWidgetPrivate + 0x80))(pQVar8,editor,&local_50);
            pQVar9 = pQVar8;
          }
          QAbstractItemViewPrivate::selectAllInEditor(pQVar9,editor);
        }
        FVar6 = QWidget::focusPolicy(editor);
        if (FVar6 != NoFocus) {
          QWidget::setFocus(editor);
        }
        goto LAB_004e5cb0;
      }
    }
    else {
LAB_004e5c2a:
      bVar4 = false;
LAB_004e5c2c:
      currentIndex(&local_50,this);
      cVar5 = (**(code **)(*(long *)this + 0x2e0))(this,&local_50,0x10,event);
      if (cVar5 == '\0') {
        pQVar9->waitForIMCommit = false;
        if (lVar2 != 0) {
          (**(code **)(*(long *)this + 0x1d8))(this,event + 0x28);
        }
        goto LAB_004e5cac;
      }
      if (!bVar4) goto LAB_004e5cb0;
      currentIndex(&local_50,this);
      pQVar7 = QAbstractItemViewPrivate::editorForIndex(pQVar9,&local_50);
      pDVar3 = (pQVar7->widget).wp.d;
      if (((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) ||
         (editor = (QWidget *)(pQVar7->widget).wp.value, editor == (QWidget *)0x0))
      goto LAB_004e5cb0;
    }
    QCoreApplication::sendEvent(&editor->super_QObject,(QEvent *)event);
  }
LAB_004e5cb0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::inputMethodEvent(QInputMethodEvent *event)
{
    Q_D(QAbstractItemView);
    // When QAbstractItemView::AnyKeyPressed is used, a new IM composition might
    // start before the editor widget acquires focus. Changing focus would interrupt
    // the composition, so we keep focus on the view until that first composition
    // is complete, and pass QInputMethoEvents on to the editor widget so that the
    // user gets the expected feedback. See also inputMethodQuery, which redirects
    // calls to the editor widget during that period.
    bool forwardEventToEditor = false;
    const bool commit = !event->commitString().isEmpty();
    const bool preediting = !event->preeditString().isEmpty();
    if (QWidget *currentEditor = d->editorForIndex(currentIndex()).widget) {
        if (d->waitForIMCommit) {
            if (commit || !preediting) {
                // commit or cancel
                d->waitForIMCommit = false;
                QApplication::sendEvent(currentEditor, event);
                if (!commit) {
                    QAbstractItemDelegate *delegate = itemDelegateForIndex(currentIndex());
                    if (delegate)
                        delegate->setEditorData(currentEditor, currentIndex());
                    d->selectAllInEditor(currentEditor);
                }
                if (currentEditor->focusPolicy() != Qt::NoFocus)
                    currentEditor->setFocus();
            } else {
                // more pre-editing
                QApplication::sendEvent(currentEditor, event);
            }
            return;
        }
    } else if (preediting) {
        // don't set focus when the editor opens
        d->waitForIMCommit = true;
        // but pass preedit on to editor
        forwardEventToEditor = true;
    } else if (!commit) {
        event->ignore();
        return;
    }
    if (!edit(currentIndex(), AnyKeyPressed, event)) {
        d->waitForIMCommit = false;
        if (commit)
            keyboardSearch(event->commitString());
        event->ignore();
    } else if (QWidget *currentEditor; forwardEventToEditor
               && (currentEditor = d->editorForIndex(currentIndex()).widget)) {
        QApplication::sendEvent(currentEditor, event);
    }
}